

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

SXML_CHAR * str_unescape(SXML_CHAR *str)

{
  SXML_CHAR *pSVar1;
  int iVar2;
  char cVar3;
  
  if (str == (SXML_CHAR *)0x0) {
    return str;
  }
  iVar2 = 0;
  pSVar1 = str;
  do {
    cVar3 = str[iVar2];
    if (cVar3 == '\\') {
      cVar3 = str[(long)iVar2 + 1];
      iVar2 = iVar2 + 1;
    }
    else if (cVar3 == '\0') {
      return str;
    }
    *pSVar1 = cVar3;
    iVar2 = iVar2 + 1;
    pSVar1 = pSVar1 + 1;
  } while( true );
}

Assistant:

SXML_CHAR* str_unescape(SXML_CHAR* str)
{
	int i, j;

	if (str == NULL)
		return NULL;

	for (i = j = 0; str[j]; j++) {
		if (str[j] == C2SX('\\'))
			j++;
		str[i++] = str[j];
	}

	return str;
}